

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_net_pton.c
# Opt level: O1

int ares_inet_net_pton_ipv4(char *src,uchar *dst,size_t size)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  void *pvVar4;
  long lVar5;
  size_t sVar6;
  int *piVar7;
  uchar *puVar8;
  uchar *puVar9;
  uint uVar10;
  uchar uVar11;
  uint uVar12;
  int iVar13;
  byte *pbVar14;
  byte *pbVar15;
  bool bVar16;
  
  memset(dst,0,size);
  pbVar14 = (byte *)(src + 1);
  bVar3 = *src;
  puVar9 = dst;
  if ((((bVar3 != 0x30) || ((*pbVar14 | 0x20) != 0x78)) || (bVar1 = src[2], (char)bVar1 < '\0')) ||
     ((9 < (byte)(bVar1 - 0x30) &&
      ((0x25 < bVar1 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0)))))) {
    iVar13 = 2;
    if (9 < (byte)(bVar3 - 0x30)) goto LAB_0011a465;
    do {
      uVar10 = (uint)(char)bVar3;
      iVar13 = 0;
      do {
        pbVar15 = pbVar14;
        pvVar4 = memchr("0123456789",uVar10,0xb);
        iVar13 = (int)pvVar4 + -0x12a971 + iVar13 * 10;
        if (0xff < iVar13) goto LAB_0011a45f;
        bVar3 = *pbVar15;
        uVar10 = (uint)(char)bVar3;
        pbVar14 = pbVar15 + 1;
      } while ((byte)(bVar3 - 0x30) < 10);
      bVar16 = size == 0;
      size = size - 1;
      if (bVar16) goto LAB_0011a44f;
      *puVar9 = (uchar)iVar13;
      puVar9 = puVar9 + 1;
      if (bVar3 != 0x2e) {
        iVar13 = 2;
        if ((bVar3 == 0) || (bVar3 == 0x2f)) goto LAB_0011a325;
        goto LAB_0011a465;
      }
      bVar3 = *pbVar14;
      pbVar14 = pbVar15 + 2;
    } while ((byte)(bVar3 - 0x30) < 10);
    goto LAB_0011a45f;
  }
  iVar13 = 0x5a;
  if (size == 0) goto LAB_0011a465;
  uVar10 = (uint)src[2];
  pbVar14 = (byte *)(src + 3);
  bVar16 = false;
  if (src[2] < '\x01') {
    bVar16 = true;
    uVar11 = '\0';
  }
  else {
    uVar12 = 0;
    do {
      uVar11 = (uchar)uVar12;
      bVar3 = (byte)uVar10;
      if ((9 < (byte)(bVar3 - 0x30)) && (5 < (byte)((bVar3 & 0x5f) + 0xbf))) break;
      if ((byte)(bVar3 + 0xbf) < 0x1a) {
        bVar3 = ares_tolower(bVar3);
        uVar10 = (uint)bVar3;
      }
      pvVar4 = memchr("0123456789abcdef",uVar10,0x11);
      uVar12 = uVar12 << 4;
      if (!bVar16) {
        uVar12 = 0;
      }
      uVar12 = uVar12 | (int)pvVar4 - 0x12a960U;
      uVar11 = (uchar)uVar12;
      bVar2 = true;
      if (bVar16) {
        if (size == 0) goto LAB_0011a44f;
        size = size - 1;
        *puVar9 = uVar11;
        puVar9 = puVar9 + 1;
        bVar2 = false;
      }
      bVar16 = bVar2;
      bVar3 = *pbVar14;
      uVar10 = (uint)(char)bVar3;
      pbVar14 = pbVar14 + 1;
    } while ('\0' < (char)bVar3);
    bVar16 = !bVar16;
    uVar11 = uVar11 << 4;
  }
  iVar13 = 0x5a;
  if (!bVar16) {
    if (size == 0) goto LAB_0011a465;
    size = size - 1;
    *puVar9 = uVar11;
    puVar9 = puVar9 + 1;
  }
LAB_0011a325:
  uVar12 = 0xffffffff;
  if (uVar10 == 0) {
LAB_0011a3a3:
    lVar5 = (long)puVar9 - (long)dst;
    iVar13 = 2;
    if (lVar5 != 0) {
      if (uVar12 == 0xffffffff) {
        bVar3 = *dst;
        uVar10 = 0x20;
        if (((bVar3 < 0xf0) && (uVar10 = 8, bVar3 < 0xe0)) && (uVar10 = 0x18, bVar3 < 0xc0)) {
          uVar10 = (uint)(bVar3 >> 7) * 8 + 8;
        }
        uVar12 = (int)lVar5 * 8;
        if (lVar5 * 8 - (ulong)uVar10 == 0 || lVar5 * 8 < (long)(ulong)uVar10) {
          uVar12 = uVar10;
        }
        if (uVar12 == 8) {
          uVar12 = (uint)(bVar3 != 0xe0) * 4 + 4;
        }
      }
      if ((long)(int)uVar12 <= lVar5 * 8) {
        return uVar12;
      }
      sVar6 = 0;
      puVar8 = puVar9;
      while (size != sVar6) {
        puVar8 = puVar8 + 1;
        puVar9[sVar6] = '\0';
        sVar6 = sVar6 + 1;
        if ((long)(int)uVar12 <= ((long)puVar8 - (long)dst) * 8) {
          return uVar12;
        }
      }
LAB_0011a44f:
      iVar13 = 0x5a;
    }
  }
  else {
    if (((uVar10 == 0x2f) && (uVar10 = (uint)*pbVar14, (byte)(*pbVar14 - 0x30) < 10)) &&
       (dst < puVar9)) {
      uVar12 = 0;
      do {
        pbVar14 = pbVar14 + 1;
        pvVar4 = memchr("0123456789",uVar10,0xb);
        uVar12 = (int)pvVar4 + -0x12a971 + uVar12 * 10;
        if (0x20 < (int)uVar12) goto LAB_0011a45f;
        bVar3 = *pbVar14;
        uVar10 = (uint)(char)bVar3;
      } while ((byte)(bVar3 - 0x30) < 10);
      if (bVar3 == 0) goto LAB_0011a3a3;
    }
LAB_0011a45f:
    iVar13 = 2;
  }
LAB_0011a465:
  piVar7 = __errno_location();
  *piVar7 = iVar13;
  return -1;
}

Assistant:

static int ares_inet_net_pton_ipv4(const char *src, unsigned char *dst,
                                   size_t size)
{
  static const char    xdigits[] = "0123456789abcdef";
  static const char    digits[]  = "0123456789";
  int                  n;
  int                  ch;
  int                  tmp = 0;
  int                  dirty;
  int                  bits;
  const unsigned char *odst = dst;

  memset(dst, 0, size);
  ch = *src++;
  if (ch == '0' && (src[0] == 'x' || src[0] == 'X') && ares_isascii(src[1]) &&
      ares_isxdigit(src[1])) {
    /* Hexadecimal: Eat nybble string. */
    if (!size) {
      goto emsgsize;
    }
    dirty = 0;
    src++; /* skip x or X. */
    while ((ch = *src++) != '\0' && ares_isascii(ch) && ares_isxdigit(ch)) {
      if (ares_isupper(ch)) {
        ch = ares_tolower((unsigned char)ch);
      }
      n = (int)(strchr(xdigits, ch) - xdigits);
      if (dirty == 0) {
        tmp = n;
      } else {
        tmp = (tmp << 4) | n;
      }
      if (++dirty == 2) {
        if (!size--) {
          goto emsgsize;
        }
        *dst++ = (unsigned char)tmp;
        dirty  = 0;
      }
    }
    if (dirty) { /* Odd trailing nybble? */
      if (!size--) {
        goto emsgsize;
      }
      *dst++ = (unsigned char)(tmp << 4);
    }
  } else if (ares_isascii(ch) && ares_isdigit(ch)) {
    /* Decimal: eat dotted digit string. */
    for (;;) {
      tmp = 0;
      do {
        n    = (int)(strchr(digits, ch) - digits);
        tmp *= 10;
        tmp += n;
        if (tmp > 255) {
          goto enoent;
        }
      } while ((ch = *src++) != '\0' && ares_isascii(ch) && ares_isdigit(ch));
      if (!size--) {
        goto emsgsize;
      }
      *dst++ = (unsigned char)tmp;
      if (ch == '\0' || ch == '/') {
        break;
      }
      if (ch != '.') {
        goto enoent;
      }
      ch = *src++;
      if (!ares_isascii(ch) || !ares_isdigit(ch)) {
        goto enoent;
      }
    }
  } else {
    goto enoent;
  }

  bits = -1;
  if (ch == '/' && ares_isascii(src[0]) && ares_isdigit(src[0]) && dst > odst) {
    /* CIDR width specifier.  Nothing can follow it. */
    ch   = *src++; /* Skip over the /. */
    bits = 0;
    do {
      n     = (int)(strchr(digits, ch) - digits);
      bits *= 10;
      bits += n;
      if (bits > 32) {
        goto enoent;
      }
    } while ((ch = *src++) != '\0' && ares_isascii(ch) && ares_isdigit(ch));
    if (ch != '\0') {
      goto enoent;
    }
  }

  /* Firey death and destruction unless we prefetched EOS. */
  if (ch != '\0') {
    goto enoent;
  }

  /* If nothing was written to the destination, we found no address. */
  if (dst == odst) {
    goto enoent; /* LCOV_EXCL_LINE: all valid paths above increment dst */
  }
  /* If no CIDR spec was given, infer width from net class. */
  if (bits == -1) {
    if (*odst >= 240) {        /* Class E */
      bits = 32;
    } else if (*odst >= 224) { /* Class D */
      bits = 8;
    } else if (*odst >= 192) { /* Class C */
      bits = 24;
    } else if (*odst >= 128) { /* Class B */
      bits = 16;
    } else {                   /* Class A */
      bits = 8;
    }
    /* If imputed mask is narrower than specified octets, widen. */
    if (bits < ((dst - odst) * 8)) {
      bits = (int)(dst - odst) * 8;
    }
    /*
     * If there are no additional bits specified for a class D
     * address adjust bits to 4.
     */
    if (bits == 8 && *odst == 224) {
      bits = 4;
    }
  }
  /* Extend network to cover the actual mask. */
  while (bits > ((dst - odst) * 8)) {
    if (!size--) {
      goto emsgsize;
    }
    *dst++ = '\0';
  }
  return bits;

enoent:
  SET_SOCKERRNO(ENOENT);
  return -1;

emsgsize:
  SET_SOCKERRNO(EMSGSIZE);
  return -1;
}